

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O0

void __thiscall zmq::pipe_t::send_disconnect_msg(pipe_t *this)

{
  size_t sVar1;
  EVP_PKEY_CTX *ctx;
  pipe_t *in_RDI;
  pipe_t *in_stack_00000040;
  
  sVar1 = msg_t::size((msg_t *)in_RDI);
  if (sVar1 != 0) {
    rollback(in_stack_00000040);
    ctx = (EVP_PKEY_CTX *)&in_RDI->_disconnect_msg;
    (*in_RDI->_out_pipe->_vptr_ypipe_base_t[2])(in_RDI->_out_pipe,ctx,0);
    flush(in_RDI);
    msg_t::init(&in_RDI->_disconnect_msg,ctx);
  }
  return;
}

Assistant:

void zmq::pipe_t::send_disconnect_msg ()
{
    if (_disconnect_msg.size () > 0) {
        // Rollback any incomplete message in the pipe, and push the disconnect message.
        rollback ();

        _out_pipe->write (_disconnect_msg, false);
        flush ();
        _disconnect_msg.init ();
    }
}